

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<double>::TPZBlockDiagonal(TPZBlockDiagonal<double> *this,TPZVec<int> *blocksize)

{
  long local_28;
  
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBlockDiagonal_0182f028;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fStorage).fStore = (double *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  local_28 = 0;
  TPZVec<long>::TPZVec(&this->fBlockPos,1,&local_28);
  (this->fBlockSize)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fBlockSize).fStore = (int *)0x0;
  (this->fBlockSize).fNElements = 0;
  (this->fBlockSize).fNAlloc = 0;
  Initialize(this,blocksize);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksize)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	Initialize(blocksize);
}